

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_delete.cpp
# Opt level: O3

PhysicalOperator * __thiscall
duckdb::DuckCatalog::PlanDelete
          (DuckCatalog *this,ClientContext *context,PhysicalPlanGenerator *planner,LogicalDelete *op
          ,PhysicalOperator *plan)

{
  pointer *pprVar1;
  TableCatalogEntry *args_1;
  iterator __position;
  int iVar2;
  reference this_00;
  pointer this_01;
  BoundReferenceExpression *pBVar3;
  undefined4 extraout_var;
  pointer this_02;
  PhysicalOperator *pPVar4;
  reference_wrapper<duckdb::PhysicalOperator> local_38;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&(op->super_LogicalOperator).expressions,0);
  this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(this_00);
  pBVar3 = BaseExpression::Cast<duckdb::BoundReferenceExpression>(&this_01->super_BaseExpression);
  args_1 = op->table;
  iVar2 = (*(args_1->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [0x10])(args_1);
  this_02 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
            operator->(&planner->physical_plan);
  pPVar4 = PhysicalPlan::
           Make<duckdb::PhysicalDelete,duckdb::vector<duckdb::LogicalType,true>&,duckdb::TableCatalogEntry&,duckdb::DataTable&,duckdb::vector<duckdb::unique_ptr<duckdb::BoundConstraint,std::default_delete<duckdb::BoundConstraint>,true>,true>,unsigned_long&,unsigned_long&,bool&>
                     (this_02,&(op->super_LogicalOperator).types,args_1,
                      (DataTable *)CONCAT44(extraout_var,iVar2),&op->bound_constraints,
                      &pBVar3->index,&(op->super_LogicalOperator).estimated_cardinality,
                      &op->return_chunk);
  __position._M_current =
       (pPVar4->children).
       super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pPVar4->children).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_38._M_data = plan;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&pPVar4->children,__position,&local_38);
  }
  else {
    (__position._M_current)->_M_data = plan;
    pprVar1 = &(pPVar4->children).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return pPVar4;
}

Assistant:

PhysicalOperator &DuckCatalog::PlanDelete(ClientContext &context, PhysicalPlanGenerator &planner, LogicalDelete &op,
                                          PhysicalOperator &plan) {
	// Get the row_id column index.
	auto &bound_ref = op.expressions[0]->Cast<BoundReferenceExpression>();
	auto &del = planner.Make<PhysicalDelete>(op.types, op.table, op.table.GetStorage(), std::move(op.bound_constraints),
	                                         bound_ref.index, op.estimated_cardinality, op.return_chunk);
	del.children.push_back(plan);
	return del;
}